

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::PrintTraceFormatVersion(cmake *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TraceFormat TVar2;
  Value *pVVar3;
  ostream *poVar4;
  Value *in_RCX;
  char *pcVar5;
  cmake *pcVar6;
  string msg;
  Value version;
  StreamWriterBuilder builder;
  Value val;
  ValueHolder local_100 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  string local_d8;
  String local_b8;
  Value local_98;
  StreamWriterBuilder local_70;
  Value local_40;
  
  if (this->Trace != true) {
    return;
  }
  paVar1 = &local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  TVar2 = this->TraceFormatVar;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  if (TVar2 == Undefined) {
    pcVar5 = "INTERNAL ERROR: Trace format is Undefined";
LAB_00371311:
    std::__cxx11::string::_M_replace((ulong)&local_d8,0,(char *)0x0,(ulong)pcVar5);
  }
  else {
    if (TVar2 == Human) {
      pcVar5 = "";
      goto LAB_00371311;
    }
    if (TVar2 != JSONv1) goto LAB_00371384;
    Json::Value::Value(&local_40,nullValue);
    Json::Value::Value(&local_98,nullValue);
    Json::StreamWriterBuilder::StreamWriterBuilder(&local_70);
    Json::Value::Value((Value *)local_100,"");
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"indentation","");
    pVVar3 = Json::StreamWriterBuilder::operator[](&local_70,&local_b8);
    Json::Value::operator=(pVVar3,(Value *)local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    Json::Value::~Value((Value *)local_100);
    Json::Value::Value((Value *)local_100,1);
    pVVar3 = Json::Value::operator[](&local_98,"major");
    Json::Value::operator=(pVVar3,(Value *)local_100);
    Json::Value::~Value((Value *)local_100);
    Json::Value::Value((Value *)local_100,2);
    pVVar3 = Json::Value::operator[](&local_98,"minor");
    Json::Value::operator=(pVVar3,(Value *)local_100);
    Json::Value::~Value((Value *)local_100);
    pVVar3 = Json::Value::operator[](&local_40,"version");
    Json::Value::operator=(pVVar3,&local_98);
    Json::writeString_abi_cxx11_((String *)local_100,(Json *)&local_70,(Factory *)&local_40,in_RCX);
    std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_100[0].bool_);
    if (local_100[0] != &local_f0) {
      operator_delete(local_100[0].string_,local_f0._M_allocated_capacity + 1);
    }
    Json::StreamWriterBuilder::~StreamWriterBuilder(&local_70);
    Json::Value::~Value(&local_98);
    Json::Value::~Value(&local_40);
  }
  if (local_d8._M_string_length != 0) {
    do {
      pcVar6 = this;
      this = pcVar6->TraceRedirect;
    } while (pcVar6->TraceRedirect != (cmake *)0x0);
    if (((byte)((pcVar6->TraceFile).super_ofstream.
                super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3] + 0x20)
               [(long)&(pcVar6->TraceFile).super_ofstream.
                       super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream] & 5)
        == 0) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&pcVar6->TraceFile,local_d8._M_dataplus._M_p,
                          local_d8._M_string_length);
      local_70.super_Factory._vptr_Factory._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_70,1);
    }
    else {
      cmSystemTools::Message(&local_d8,(char *)0x0);
    }
  }
LAB_00371384:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmake::PrintTraceFormatVersion()
{
  if (!this->GetTrace()) {
    return;
  }

  std::string msg;

  switch (this->GetTraceFormat()) {
    case TraceFormat::JSONv1: {
#ifndef CMAKE_BOOTSTRAP
      Json::Value val;
      Json::Value version;
      Json::StreamWriterBuilder builder;
      builder["indentation"] = "";
      version["major"] = 1;
      version["minor"] = 2;
      val["version"] = version;
      msg = Json::writeString(builder, val);
#endif
      break;
    }
    case TraceFormat::Human:
      msg = "";
      break;
    case TraceFormat::Undefined:
      msg = "INTERNAL ERROR: Trace format is Undefined";
      break;
  }

  if (msg.empty()) {
    return;
  }

  auto& f = this->GetTraceFile();
  if (f) {
    f << msg << '\n';
  } else {
    cmSystemTools::Message(msg);
  }
}